

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryCompileCommand.h
# Opt level: O0

cmCommand * __thiscall cmTryCompileCommand::Clone(cmTryCompileCommand *this)

{
  cmCommand *this_00;
  cmTryCompileCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0xb8);
  cmTryCompileCommand((cmTryCompileCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTryCompileCommand;
    }